

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void * Stack_Pop(Stack *stack)

{
  Stack_Node *__ptr;
  Stack_Node *temp_first;
  void *return_value;
  Stack *stack_local;
  
  temp_first = (Stack_Node *)0x0;
  if (stack->first != (Stack_Node *)0x0) {
    __ptr = stack->first;
    temp_first = (Stack_Node *)stack->first->data;
    stack->size = stack->size - 1;
    stack->first = stack->first->next;
    free(__ptr);
  }
  return temp_first;
}

Assistant:

void* Stack_Pop(Stack *stack)
{
    void* return_value=NULL;
    if(stack->first!=NULL)
    {
        struct Stack_Node *temp_first=stack->first;
        return_value=stack->first->data;

        --stack->size;
        stack->first=stack->first->next;
        free(temp_first);
    }

    return return_value;
}